

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::SPPParameter::SharedCtor(SPPParameter *this)

{
  SPPParameter *this_local;
  
  this->_cached_size_ = 0;
  memset(&this->pyramid_height_,0,0xc);
  return;
}

Assistant:

void SPPParameter::SharedCtor() {
  _cached_size_ = 0;
  ::memset(&pyramid_height_, 0, reinterpret_cast<char*>(&engine_) -
    reinterpret_cast<char*>(&pyramid_height_) + sizeof(engine_));
}